

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::CartesianProductGenerator<const_trust_token_method_st_*,_bool,_bool,_int>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>::IteratorImpl
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_> *this,
          ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_> *base
          ,tuple<testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>,_testing::internal::ParamGenerator<bool>,_testing::internal::ParamGenerator<int>_>
           *generators,bool is_end)

{
  tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<int>_>
  *local_a0;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ParamGenerator<bool> local_48;
  ParamGenerator<const_trust_token_method_st_*> local_30;
  tuple<testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>,_testing::internal::ParamGenerator<bool>,_testing::internal::ParamGenerator<int>_>
  *ptStack_20;
  bool is_end_local;
  tuple<testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>,_testing::internal::ParamGenerator<bool>,_testing::internal::ParamGenerator<int>_>
  *generators_local;
  ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_> *base_local;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_> *this_local;
  
  local_30.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_trust_token_method_st_*>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._7_1_ = is_end;
  ptStack_20 = generators;
  generators_local =
       (tuple<testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>,_testing::internal::ParamGenerator<bool>,_testing::internal::ParamGenerator<int>_>
        *)base;
  base_local = (ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>
                *)this;
  ParamIteratorInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>::
  ParamIteratorInterface
            (&this->
              super_ParamIteratorInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>
            );
  (this->super_ParamIteratorInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>).
  _vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_00ab0038;
  this->base_ = (ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>
                 *)generators_local;
  std::
  get<0ul,testing::internal::ParamGenerator<trust_token_method_st_const*>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<int>>
            (ptStack_20);
  ParamGenerator<const_trust_token_method_st_*>::begin(&local_30);
  std::
  get<1ul,testing::internal::ParamGenerator<trust_token_method_st_const*>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<int>>
            (ptStack_20);
  ParamGenerator<bool>::begin(&local_48);
  std::
  get<2ul,testing::internal::ParamGenerator<trust_token_method_st_const*>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<int>>
            (ptStack_20);
  ParamGenerator<bool>::begin((ParamGenerator<bool> *)(local_58 + 8));
  std::
  get<3ul,testing::internal::ParamGenerator<trust_token_method_st_const*>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<int>>
            (ptStack_20);
  ParamGenerator<int>::begin((ParamGenerator<int> *)local_58);
  std::
  tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<int>_>
  ::
  tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<int>,_true,_true>
            (&this->begin_,(ParamIterator<const_trust_token_method_st_*> *)&local_30,
             (ParamIterator<bool> *)&local_48,(ParamIterator<bool> *)(local_58 + 8),
             (ParamIterator<int> *)local_58);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)local_58);
  ParamIterator<bool>::~ParamIterator((ParamIterator<bool> *)(local_58 + 8));
  ParamIterator<bool>::~ParamIterator((ParamIterator<bool> *)&local_48);
  ParamIterator<const_trust_token_method_st_*>::~ParamIterator
            ((ParamIterator<const_trust_token_method_st_*> *)&local_30);
  std::
  get<0ul,testing::internal::ParamGenerator<trust_token_method_st_const*>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<int>>
            (ptStack_20);
  ParamGenerator<const_trust_token_method_st_*>::end
            ((ParamGenerator<const_trust_token_method_st_*> *)(local_68 + 8));
  std::
  get<1ul,testing::internal::ParamGenerator<trust_token_method_st_const*>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<int>>
            (ptStack_20);
  ParamGenerator<bool>::end((ParamGenerator<bool> *)local_68);
  std::
  get<2ul,testing::internal::ParamGenerator<trust_token_method_st_const*>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<int>>
            (ptStack_20);
  ParamGenerator<bool>::end((ParamGenerator<bool> *)(local_78 + 8));
  std::
  get<3ul,testing::internal::ParamGenerator<trust_token_method_st_const*>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<bool>,testing::internal::ParamGenerator<int>>
            (ptStack_20);
  ParamGenerator<int>::end((ParamGenerator<int> *)local_78);
  std::
  tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<int>_>
  ::
  tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<int>,_true,_true>
            (&this->end_,(ParamIterator<const_trust_token_method_st_*> *)(local_68 + 8),
             (ParamIterator<bool> *)local_68,(ParamIterator<bool> *)(local_78 + 8),
             (ParamIterator<int> *)local_78);
  ParamIterator<int>::~ParamIterator((ParamIterator<int> *)local_78);
  ParamIterator<bool>::~ParamIterator((ParamIterator<bool> *)(local_78 + 8));
  ParamIterator<bool>::~ParamIterator((ParamIterator<bool> *)local_68);
  ParamIterator<const_trust_token_method_st_*>::~ParamIterator
            ((ParamIterator<const_trust_token_method_st_*> *)(local_68 + 8));
  if ((local_30.impl_.
       super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_trust_token_method_st_*>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi._7_1_ & 1) == 0) {
    local_a0 = &this->begin_;
  }
  else {
    local_a0 = &this->end_;
  }
  std::
  tuple<testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<bool>,_testing::internal::ParamIterator<int>_>
  ::tuple(&this->current_,local_a0);
  std::shared_ptr<std::tuple<const_trust_token_method_st_*,_bool,_bool,_int>_>::shared_ptr
            (&this->current_value_);
  ComputeCurrentValue(this);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }